

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

int nuraft::buffer::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  
  if ((int)*__child_stack < 0) {
    uVar2 = *__child_stack & 0x7fffffff;
  }
  else {
    uVar2 = (uint)*__child_stack;
  }
  alloc((buffer *)__fn,(ulong)uVar2);
  uVar2 = *__child_stack;
  if ((int)uVar2 < 0) {
    uVar3 = uVar2 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*__child_stack;
  }
  memcpy(*(uint **)__fn + (ulong)(**(uint **)__fn >> 0x1f) + 1,
         (void *)((long)__child_stack + (ulong)(uVar2 >> 0x1f) * 4 + 4),(ulong)uVar3);
  piVar1 = *(int **)__fn;
  if (*piVar1 < 0) {
    piVar1[1] = 0;
  }
  else {
    *(undefined2 *)((long)piVar1 + 2) = 0;
  }
  return (int)__fn;
}

Assistant:

ptr<buffer> buffer::clone(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size());

    byte* dst = other->data_begin();
    byte* src = buf.data_begin();
    ::memcpy(dst, src, buf.size());

    other->pos(0);
    return other;
}